

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O0

void __thiscall CreditCard::CreditCard(CreditCard *this)

{
  CreditCard *this_local;
  
  Transaction::Transaction(&this->super_Transaction);
  (this->super_Transaction)._vptr_Transaction = (_func_int **)&PTR_display_00108d18;
  std::__cxx11::string::string((string *)&this->cardNumber);
  std::__cxx11::string::string((string *)&this->expirationDate);
  std::__cxx11::string::string((string *)&this->cvv);
  std::__cxx11::string::operator=((string *)&this->cardNumber,"0000 0000 0000 0000");
  std::__cxx11::string::operator=((string *)&this->expirationDate,"01/01/2020");
  std::__cxx11::string::operator=((string *)&this->cvv,"000");
  return;
}

Assistant:

CreditCard::CreditCard()
{
    cardNumber = "0000 0000 0000 0000";
    expirationDate = "01/01/2020";
    cvv = "000";
}